

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O1

void __thiscall embree::Tutorial::Tutorial(Tutorial *this)

{
  CommandLineParser *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_class_1_0_00000001_for_f local_61;
  string local_60;
  string local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"collide","");
  TutorialApplication::TutorialApplication(&this->super_TutorialApplication,&local_60,1,0x200,0x200)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (this->super_TutorialApplication).super_Application._vptr_Application =
       (_func_int **)&PTR__TutorialApplication_002cea70;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"benchmark-collision","");
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"--benchmark-collision: benchmarks collision detection","");
  this_00 = &(this->super_TutorialApplication).super_Application.commandLineParser;
  CommandLineParser::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (this_00,&local_60,&local_61,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"complexity","");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"--complexity: sets grid and sphere geometric complexity","");
  CommandLineParser::
  registerOption<embree::Tutorial::Tutorial()::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,&local_60,(anon_class_1_0_00000001_for_f *)&local_61,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  *(undefined8 *)&(this->super_TutorialApplication).camera.from.field_0 = 0x40200000c0200000;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.from.field_0 + 8) = 0xc0200000;
  *(undefined8 *)&(this->super_TutorialApplication).camera.to.field_0 = 0;
  *(undefined8 *)((long)&(this->super_TutorialApplication).camera.to.field_0 + 8) = 0;
  return;
}

Assistant:

Tutorial()
      : TutorialApplication("collide",FEATURE_RTCORE)
    {
      registerOption("benchmark-collision", [] (Ref<ParseStream> cin, const FileName& path) {
          benchmark = true;
        }, "--benchmark-collision: benchmarks collision detection");

      registerOption("complexity", [] (Ref<ParseStream> cin, const FileName& path) {
          int N = cin->getInt();
          numPhi = N;
          numTheta = 2*numPhi;
          NX = N;
          NZ = N;
        }, "--complexity: sets grid and sphere geometric complexity");
                       
      camera.from = Vec3fa(-2.5f,2.5f,-2.5f);
      camera.to   = Vec3fa(0.0f,0.0f,0.0f);
    }